

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<double>::TensorProductIJ
          (TPZFrontNonSym<double> *this,int ithread,STensorProductMTData *data)

{
  double dVar1;
  int iVar2;
  int64_t iVar3;
  double *pdVar4;
  long in_RDX;
  int in_ESI;
  TPZFrontNonSym<double> *in_RDI;
  double *ColValPtr;
  double *ElemPtr;
  int i;
  double RowVal;
  int j;
  int Nthreads;
  int n;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  int64_t in_stack_ffffffffffffffa8;
  double *local_48;
  STensorProductMTData *in_stack_ffffffffffffffc0;
  int local_34;
  int local_24;
  
  if (in_RDX == 0) {
    pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
  }
  while( true ) {
    if ((*(byte *)(in_RDX + 0x108) & 1) == 0) {
      return;
    }
    TPZVec<TPZSemaphore>::operator[]((TPZVec<TPZSemaphore> *)(in_RDX + 0x90),(long)in_ESI);
    TPZSemaphore::Wait(&in_stack_ffffffffffffffc0->fWorkDoneSem);
    if ((*(byte *)(in_RDX + 0x108) & 1) == 0) break;
    iVar3 = TPZVec<double>::NElements(*(TPZVec<double> **)(in_RDX + 200));
    iVar2 = TPZFront<double>::STensorProductMTData::NThreads((STensorProductMTData *)0x1d1ab89);
    for (local_24 = in_ESI; local_24 < (int)iVar3; local_24 = iVar2 + local_24) {
      pdVar4 = TPZVec<double>::operator[](*(TPZVec<double> **)(in_RDX + 0xd0),(long)local_24);
      dVar1 = *pdVar4;
      local_34 = 0;
      in_stack_ffffffffffffffc0 =
           (STensorProductMTData *)Element(in_RDI,in_stack_ffffffffffffffa8,0x1d1abe2);
      local_48 = TPZVec<double>::operator[](*(TPZVec<double> **)(in_RDX + 200),0);
      for (; local_34 < (int)iVar3; local_34 = local_34 + 1) {
        *(double *)&in_stack_ffffffffffffffc0->fWorkDoneSem =
             -*local_48 * dVar1 + *(double *)&in_stack_ffffffffffffffc0->fWorkDoneSem;
        local_48 = local_48 + 1;
        in_stack_ffffffffffffffc0 =
             (STensorProductMTData *)&(in_stack_ffffffffffffffc0->fWorkDoneSem).fMutex;
      }
    }
    TPZFront<double>::STensorProductMTData::WorkDone(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::TensorProductIJ(int ithread,typename TPZFront<TVar>::STensorProductMTData *data){
  if(!data) DebugStop();
  while(data->fRunning){
    data->fWorkSem[ithread].Wait();
    if(!data->fRunning) break;
    const int n = data->fAuxVecCol->NElements();
    const int Nthreads = data->NThreads();
		
    for(int j = 0 + ithread; j < n; j += Nthreads){
      const TVar RowVal = data->fAuxVecRow->operator[](j);
      int i = 0;
      TVar * ElemPtr = &(this->Element(i,j));
      TVar * ColValPtr = &(data->fAuxVecCol->operator[](i));
      for(; i < n; i++, ColValPtr++, ElemPtr++){
        (*ElemPtr) -=  (*ColValPtr) * RowVal;
      }///i
    }///j
    data->WorkDone();
  }///while
}